

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSampleImages.cpp
# Opt level: O1

void anon_unknown.dwarf_2cf4e7::readImage(char *fileName,uint correctChecksum)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  int *piVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  undefined4 uVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  RgbaInputFile in;
  Rgba local_70 [8];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"file ",5);
  if (fileName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1f2f58);
  }
  else {
    sVar4 = strlen(fileName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::ostream::flush();
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_70,fileName,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"version ",8);
  iVar3 = Imf_3_2::RgbaInputFile::version();
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::ostream::flush();
  piVar6 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  iVar3 = *piVar6;
  iVar12 = (piVar6[2] - iVar3) + 1;
  iVar2 = piVar6[1];
  uVar11 = ((piVar6[3] - iVar2) + 1) * iVar12;
  uVar9 = 0xffffffffffffffff;
  if (-1 < (int)uVar11) {
    uVar9 = (long)(int)uVar11 * 8;
  }
  pvVar7 = operator_new__(uVar9);
  Imf_3_2::RgbaInputFile::setFrameBuffer
            (local_70,(long)pvVar7 + (long)(iVar2 * iVar12) * -8 + (long)iVar3 * -8,1);
  lVar8 = Imf_3_2::RgbaInputFile::dataWindow();
  iVar3 = *(int *)(lVar8 + 4);
  Imf_3_2::RgbaInputFile::dataWindow();
  Imf_3_2::RgbaInputFile::readPixels((int)local_70,iVar3);
  if ((int)uVar11 < 1) {
    uVar10 = 0;
  }
  else {
    uVar9 = 0;
    uVar10 = 0;
    do {
      uVar1 = *(ulong *)((long)pvVar7 + uVar9 * 8);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar1;
      uVar14 = (undefined4)(uVar1 >> 0x20);
      auVar15._4_4_ = uVar14;
      auVar15._0_4_ = uVar14;
      auVar15._8_4_ = uVar14;
      auVar15._12_4_ = uVar14;
      uVar10 = uVar10 ^ (ushort)(SUB162(auVar15 ^ auVar13,2) ^ SUB162(auVar15 ^ auVar13,0));
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"checksum = ",0xb);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (uVar10 != correctChecksum) {
    __assert_fail("checksum == correctChecksum",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                  ,0x3b,"void (anonymous namespace)::readImage(const char *, unsigned int)");
  }
  operator_delete__(pvVar7);
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_70);
  return;
}

Assistant:

void
readImage (const char fileName[], unsigned int correctChecksum)
{
    cout << "file " << fileName << " " << flush;

    OPENEXR_IMF_NAMESPACE::RgbaInputFile in (fileName);

    cout << "version " << in.version () << " " << flush;

    const Box2i& dw = in.dataWindow ();

    int w  = dw.max.x - dw.min.x + 1;
    int h  = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels (w * h);
    in.setFrameBuffer (pixels - dx - dy * w, 1, w);
    in.readPixels (in.dataWindow ().min.y, in.dataWindow ().max.y);

    unsigned int checksum = 0;

    for (int i = 0; i < w * h; ++i)
    {
        checksum ^= pixels[i].r.bits ();
        checksum ^= pixels[i].g.bits ();
        checksum ^= pixels[i].b.bits ();
        checksum ^= pixels[i].a.bits ();
    }

    cout << "checksum = " << checksum << endl;

    assert (checksum == correctChecksum);
}